

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_test.cc
# Opt level: O1

bool SetupContext(FileTest *t,KeyMap *key_map,EVP_PKEY_CTX *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  string *psVar5;
  FileTest *pFVar6;
  EVP_MD *pEVar7;
  string *psVar8;
  const_iterator cVar9;
  mapped_type *pmVar10;
  string *name;
  UniquePtr<uint8_t> buf;
  vector<unsigned_char,_std::allocator<unsigned_char>_> label;
  string local_98;
  undefined1 local_78 [32];
  AssertHelper local_58;
  string local_50;
  
  psVar8 = &local_98;
  name = &local_98;
  paVar1 = &local_98.field_2;
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"RSAPadding","");
  bVar3 = FileTest::HasAttribute(t,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (bVar3) {
    local_98._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"RSAPadding","");
    psVar5 = FileTest::GetAttributeOrDie(t,&local_98);
    iVar4 = std::__cxx11::string::compare((char *)psVar5);
    bVar3 = true;
    if (iVar4 == 0) {
      iVar4 = 1;
    }
    else {
      iVar4 = std::__cxx11::string::compare((char *)psVar5);
      if (iVar4 == 0) {
        iVar4 = 6;
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)psVar5);
        if (iVar4 == 0) {
          iVar4 = 4;
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)psVar5);
          if (iVar4 == 0) {
            iVar4 = 3;
          }
          else {
            testing::Message::Message((Message *)&local_50);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_50._M_dataplus._M_p + 0x10),"Unknown RSA padding mode: ",
                       0x1a);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_50._M_dataplus._M_p + 0x10),(psVar5->_M_dataplus)._M_p,
                       psVar5->_M_string_length);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)local_78,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_test.cc"
                       ,0x67,"Failed");
            psVar5 = &local_50;
            testing::internal::AssertHelper::operator=((AssertHelper *)local_78,(Message *)psVar5);
            iVar4 = (int)psVar5;
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_78);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              (**(code **)(*(size_type *)local_50._M_dataplus._M_p + 8))();
            }
            bVar3 = false;
          }
        }
      }
    }
    if (!bVar3) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p == paVar1) {
        return false;
      }
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      return false;
    }
    iVar4 = EVP_PKEY_CTX_set_rsa_padding(ctx,iVar4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if (iVar4 == 0) {
      return false;
    }
  }
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"PSSSaltLength","");
  bVar3 = FileTest::HasAttribute(t,&local_98);
  if (bVar3) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"PSSSaltLength","");
    psVar5 = FileTest::GetAttributeOrDie(t,&local_50);
    iVar4 = atoi((psVar5->_M_dataplus)._M_p);
    iVar4 = EVP_PKEY_CTX_set_rsa_pss_saltlen(ctx,iVar4);
    bVar3 = iVar4 == 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar3 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (!bVar3) {
    local_98._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"MGF1Digest","");
    bVar3 = FileTest::HasAttribute(t,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if (bVar3) {
      local_98._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"MGF1Digest","");
      pFVar6 = (FileTest *)FileTest::GetAttributeOrDie(t,&local_98);
      pEVar7 = GetDigest(pFVar6,psVar8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar1) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if (pEVar7 == (EVP_MD *)0x0) {
        return false;
      }
      iVar4 = EVP_PKEY_CTX_set_rsa_mgf1_md(ctx,pEVar7);
      if (iVar4 == 0) {
        return false;
      }
    }
    local_98._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"OAEPDigest","");
    bVar3 = FileTest::HasAttribute(t,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if (bVar3) {
      local_98._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"OAEPDigest","");
      pFVar6 = (FileTest *)FileTest::GetAttributeOrDie(t,&local_98);
      pEVar7 = GetDigest(pFVar6,name);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar1) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if (pEVar7 == (EVP_MD *)0x0) {
        return false;
      }
      iVar4 = EVP_PKEY_CTX_set_rsa_oaep_md(ctx,pEVar7);
      if (iVar4 == 0) {
        return false;
      }
    }
    local_98._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"OAEPLabel","");
    bVar3 = FileTest::HasAttribute(t,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if (bVar3) {
      local_78._0_8_ = (AssertHelperData *)0x0;
      local_78._8_8_ = (pointer)0x0;
      local_78._16_8_ = (pointer)0x0;
      local_98._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"OAEPLabel","");
      bVar3 = FileTest::GetBytes(t,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78
                                 ,&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar1) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if (bVar3) {
        local_98._M_dataplus._M_p =
             (pointer)OPENSSL_memdup((void *)local_78._0_8_,local_78._8_8_ - local_78._0_8_);
        if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_98._M_dataplus._M_p ==
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0) ||
           (iVar4 = EVP_PKEY_CTX_set0_rsa_oaep_label
                              (ctx,(uint8_t *)local_98._M_dataplus._M_p,
                               local_78._8_8_ - local_78._0_8_), iVar4 == 0)) {
          bVar3 = false;
        }
        else {
          local_98._M_dataplus._M_p = (pointer)0x0;
          bVar3 = true;
        }
        std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)&local_98);
      }
      else {
        bVar3 = false;
      }
      if ((AssertHelperData *)local_78._0_8_ != (AssertHelperData *)0x0) {
        operator_delete((void *)local_78._0_8_,local_78._16_8_ - local_78._0_8_);
      }
      if (!bVar3) {
        return false;
      }
    }
    local_98._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"DerivePeer","");
    bVar3 = FileTest::HasAttribute(t,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if (bVar3) {
      local_78._0_8_ = (AssertHelperData *)(local_78 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"DerivePeer","");
      psVar8 = FileTest::GetAttributeOrDie(t,(string *)local_78);
      pcVar2 = (psVar8->_M_dataplus)._M_p;
      local_98._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_98,pcVar2,pcVar2 + psVar8->_M_string_length);
      if ((AssertHelperData *)local_78._0_8_ != (AssertHelperData *)(local_78 + 0x10)) {
        operator_delete((void *)local_78._0_8_,(ulong)(local_78._16_8_ + 1));
      }
      cVar9 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>_>_>_>
              ::find(&key_map->_M_t,&local_98);
      if ((_Rb_tree_header *)cVar9._M_node == &(key_map->_M_t)._M_impl.super__Rb_tree_header) {
        testing::Message::Message((Message *)local_78);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_78._0_8_ + 0x10),"Could not find key ",0x13);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_78._0_8_ + 0x10),local_98._M_dataplus._M_p,
                   local_98._M_string_length);
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_test.cc"
                   ,0x135,"Failed");
        testing::internal::AssertHelper::operator=(&local_58,(Message *)local_78);
        testing::internal::AssertHelper::~AssertHelper(&local_58);
        if ((AssertHelperData *)local_78._0_8_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_78._0_8_ + 8))();
        }
        bVar3 = false;
      }
      else {
        pmVar10 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>_>_>_>
                  ::operator[](key_map,&local_98);
        iVar4 = EVP_PKEY_derive_set_peer
                          ((EVP_PKEY_CTX *)ctx,
                           (EVP_PKEY *)
                           (pmVar10->_M_t).
                           super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl);
        bVar3 = iVar4 != 0;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar1) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if (!bVar3) {
        return false;
      }
    }
    local_98._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"DiffieHellmanPad","");
    bVar3 = FileTest::HasAttribute(t,&local_98);
    if (bVar3) {
      iVar4 = EVP_PKEY_CTX_set_dh_pad(ctx,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar1) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if (iVar4 == 0) {
        return false;
      }
    }
    else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    return true;
  }
  return false;
}

Assistant:

static bool SetupContext(FileTest *t, KeyMap *key_map, EVP_PKEY_CTX *ctx) {
  if (t->HasAttribute("RSAPadding")) {
    int padding;
    if (!GetRSAPadding(t, &padding, t->GetAttributeOrDie("RSAPadding")) ||
        !EVP_PKEY_CTX_set_rsa_padding(ctx, padding)) {
      return false;
    }
  }
  if (t->HasAttribute("PSSSaltLength") &&
      !EVP_PKEY_CTX_set_rsa_pss_saltlen(
          ctx, atoi(t->GetAttributeOrDie("PSSSaltLength").c_str()))) {
    return false;
  }
  if (t->HasAttribute("MGF1Digest")) {
    const EVP_MD *digest = GetDigest(t, t->GetAttributeOrDie("MGF1Digest"));
    if (digest == nullptr || !EVP_PKEY_CTX_set_rsa_mgf1_md(ctx, digest)) {
      return false;
    }
  }
  if (t->HasAttribute("OAEPDigest")) {
    const EVP_MD *digest = GetDigest(t, t->GetAttributeOrDie("OAEPDigest"));
    if (digest == nullptr || !EVP_PKEY_CTX_set_rsa_oaep_md(ctx, digest)) {
      return false;
    }
  }
  if (t->HasAttribute("OAEPLabel")) {
    std::vector<uint8_t> label;
    if (!t->GetBytes(&label, "OAEPLabel")) {
      return false;
    }
    // For historical reasons, |EVP_PKEY_CTX_set0_rsa_oaep_label| expects to be
    // take ownership of the input.
    bssl::UniquePtr<uint8_t> buf(reinterpret_cast<uint8_t *>(
        OPENSSL_memdup(label.data(), label.size())));
    if (!buf ||
        !EVP_PKEY_CTX_set0_rsa_oaep_label(ctx, buf.get(), label.size())) {
      return false;
    }
    buf.release();
  }
  if (t->HasAttribute("DerivePeer")) {
    std::string derive_peer = t->GetAttributeOrDie("DerivePeer");
    if (key_map->count(derive_peer) == 0) {
      ADD_FAILURE() << "Could not find key " << derive_peer;
      return false;
    }
    EVP_PKEY *derive_peer_key = (*key_map)[derive_peer].get();
    if (!EVP_PKEY_derive_set_peer(ctx, derive_peer_key)) {
      return false;
    }
  }
  if (t->HasAttribute("DiffieHellmanPad") && !EVP_PKEY_CTX_set_dh_pad(ctx, 1)) {
    return false;
  }
  return true;
}